

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSNet.h
# Opt level: O3

int LaunchMultiCliTCPSrv(char *port,_func_int_SOCKET_void_ptr *handlecli,void *pParam)

{
  SOCKET SVar1;
  int iVar2;
  int iVar3;
  undefined8 *pParam_00;
  byte bVar4;
  SOCKET socksrv;
  THREAD_IDENTIFIER handlecliThreadId;
  timeval tv;
  fd_set sock_set;
  sockaddr_storage addr;
  char hostname [1025];
  SOCKET local_588;
  socklen_t local_584;
  _func_int_SOCKET_void_ptr *local_580;
  void *local_578;
  pthread_t local_570;
  timeval local_568;
  fd_set local_558;
  sockaddr local_4d8;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  char local_458 [32];
  char local_438 [1032];
  
  local_588 = -1;
  iVar2 = inittcpsrv(&local_588,"0.0.0.0",port,0x1000,10000);
  if (iVar2 == 0) {
    local_580 = handlecli;
    local_578 = pParam;
    while( true ) {
      do {
        SVar1 = local_588;
        local_568.tv_sec = 10;
        local_568.tv_usec = 0;
        local_558.fds_bits[0] = 0;
        local_558.fds_bits[1] = 0;
        local_558.fds_bits[2] = 0;
        local_558.fds_bits[3] = 0;
        local_558.fds_bits[4] = 0;
        local_558.fds_bits[5] = 0;
        local_558.fds_bits[6] = 0;
        local_558.fds_bits[7] = 0;
        local_558.fds_bits[8] = 0;
        local_558.fds_bits[9] = 0;
        local_558.fds_bits[10] = 0;
        local_558.fds_bits[0xb] = 0;
        iVar2 = local_588 + 0x3f;
        if (-1 < local_588) {
          iVar2 = local_588;
        }
        bVar4 = (byte)(local_588 % 0x40);
        local_558.fds_bits[0xc] = 0;
        local_558.fds_bits[0xd] = 0;
        local_558.fds_bits[0xe] = 0;
        local_558.fds_bits[0xf] = 0;
        local_558.fds_bits[iVar2 >> 6] = local_558.fds_bits[iVar2 >> 6] | 1L << (bVar4 & 0x3f);
        iVar3 = select(local_588 + 1,&local_558,(fd_set *)0x0,(fd_set *)0x0,&local_568);
        bVar4 = bVar4 & 0x3f;
        local_558.fds_bits[iVar2 >> 6] =
             local_558.fds_bits[iVar2 >> 6] & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
      } while (iVar3 == 0);
      if (iVar3 == -1) goto LAB_0010ff5f;
      local_468 = 0;
      uStack_460 = 0;
      local_478 = 0;
      uStack_470 = 0;
      local_488 = 0;
      uStack_480 = 0;
      local_498 = 0;
      uStack_490 = 0;
      local_4a8 = 0;
      uStack_4a0 = 0;
      local_4b8 = 0;
      uStack_4b0 = 0;
      local_4c8 = 0;
      uStack_4c0 = 0;
      local_4d8.sa_family = 0;
      local_4d8.sa_data[0] = '\0';
      local_4d8.sa_data[1] = '\0';
      local_4d8.sa_data[2] = '\0';
      local_4d8.sa_data[3] = '\0';
      local_4d8.sa_data[4] = '\0';
      local_4d8.sa_data[5] = '\0';
      local_4d8.sa_data[6] = '\0';
      local_4d8.sa_data[7] = '\0';
      local_4d8.sa_data[8] = '\0';
      local_4d8.sa_data[9] = '\0';
      local_4d8.sa_data[10] = '\0';
      local_4d8.sa_data[0xb] = '\0';
      local_4d8.sa_data[0xc] = '\0';
      local_4d8.sa_data[0xd] = '\0';
      local_584 = 0x80;
      iVar2 = accept(SVar1,&local_4d8,&local_584);
      if (iVar2 == -1) goto LAB_0010ff5f;
      iVar3 = getnameinfo(&local_4d8,local_584,local_438,0x401,local_458,0x20,3);
      if (iVar3 != 0) break;
      pParam_00 = (undefined8 *)calloc(1,0x18);
      if (pParam_00 == (undefined8 *)0x0) {
LAB_0010ff31:
        shutdown(iVar2,2);
        close(iVar2);
      }
      else {
        *pParam_00 = local_580;
        *(int *)(pParam_00 + 1) = iVar2;
        pParam_00[2] = local_578;
        iVar3 = CreateDefaultThread(handlecliThreadProc,pParam_00,&local_570);
        if (iVar3 != 0) {
          free(pParam_00);
          goto LAB_0010ff31;
        }
        pthread_detach(local_570);
      }
    }
    close(iVar2);
LAB_0010ff5f:
    SVar1 = local_588;
    shutdown(local_588,2);
    close(SVar1);
  }
  return 1;
}

Assistant:

inline int LaunchMultiCliTCPSrv(char* port, int (*handlecli)(SOCKET, void*), void* pParam)
{
	int iResult = EXIT_FAILURE;
	SOCKET socksrv = INVALID_SOCKET;
	SOCKET sockcli = INVALID_SOCKET;
	THREAD_IDENTIFIER handlecliThreadId;
	HANDLECLITHREADPARAM* pHandlecliThreadParam = NULL;

	if (inittcpsrv(&socksrv, "0.0.0.0", port, SOMAXCONN, DEFAULT_SOCK_TIMEOUT) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	for (;;)
	{
		iResult = waitforclifortcpsrv(socksrv, &sockcli, DEFAULT_SOCK_TIMEOUT);
		switch (iResult)
		{
		case EXIT_SUCCESS:		
			pHandlecliThreadParam = (HANDLECLITHREADPARAM*)calloc(1, sizeof(HANDLECLITHREADPARAM));
			if (!pHandlecliThreadParam)	
			{
				PRINT_DEBUG_WARNING_OSNET(("LaunchMultiCliTCPSrv warning (%s) : %s\n", 
					strtime_m(), 
					"Unable to handle new client. "));
				if (disconnectclifromtcpsrv(sockcli) != EXIT_SUCCESS)
				{
					PRINT_DEBUG_WARNING_OSNET(("LaunchMultiCliTCPSrv warning (%s) : %s\n", 
						strtime_m(), 
						"Error disconnecting a client. "));
				}
				break;
			}
			pHandlecliThreadParam->handlecli = handlecli;
			pHandlecliThreadParam->sockcli = sockcli;
			pHandlecliThreadParam->pParam = pParam;
			if (CreateDefaultThread(handlecliThreadProc, pHandlecliThreadParam, &handlecliThreadId) != EXIT_SUCCESS)
			{
				PRINT_DEBUG_WARNING_OSNET(("LaunchMultiCliTCPSrv warning (%s) : %s\n", 
					strtime_m(), 
					"Unable to handle new client. "));
				free(pHandlecliThreadParam);
				if (disconnectclifromtcpsrv(sockcli) != EXIT_SUCCESS)
				{
					PRINT_DEBUG_WARNING_OSNET(("LaunchMultiCliTCPSrv warning (%s) : %s\n", 
						strtime_m(), 
						"Error disconnecting a client. "));
				}
				break;
			}
			if (DetachThread(handlecliThreadId) != EXIT_SUCCESS)
			{
				PRINT_DEBUG_WARNING_OSNET(("LaunchMultiCliTCPSrv warning (%s) : %s\n", 
					strtime_m(), 
					"Error processing new client. "));
			}
			break;
		case EXIT_TIMEOUT:
			break;
		default:
			releasetcpsrv(socksrv);
			return EXIT_FAILURE;
		}
	}

	if (releasetcpsrv(socksrv) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}